

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O0

int parse(lua_State *L)

{
  ravi_State *prVar1;
  int iVar2;
  char *__s;
  _func_size_t_void_ptr **pp_Stack_d0;
  int rc;
  Ravi_CompilerInterface ravicomp_interface;
  C_MemoryAllocator allocator;
  CompilerContext ccontext;
  char *mainfunc;
  char *s;
  lua_State *L_local;
  
  __s = luaL_checklstring(L,1,(size_t *)0x0);
  ccontext.jit = (ravi_State *)0x0;
  iVar2 = lua_isstring(L,2);
  if (iVar2 != 0) {
    ccontext.jit = (ravi_State *)luaL_checklstring(L,2,(size_t *)0x0);
  }
  prVar1 = L->l_G->ravi_state;
  allocator.destroy_arena = (_func_size_t_void_ptr *)L;
  ravicomp_interface.error_message = (_func_void_void_ptr_char_ptr *)create_mspace(0,0);
  allocator.arena = mspace_realloc;
  allocator.realloc = mspace_calloc;
  allocator.calloc = mspace_free;
  allocator.free = create_mspace;
  allocator.create_arena = destroy_mspace;
  pp_Stack_d0 = &allocator.destroy_arena;
  ravicomp_interface.context = __s;
  ravicomp_interface.source = (char *)strlen(__s);
  ravicomp_interface.source_len = (long)"_IO_input" + 4;
  ravicomp_interface.source_name = "--dump-ast";
  memset(&ravicomp_interface.compiler_options,0,0x1f);
  ravicomp_interface._64_8_ = &ravicomp_interface.error_message;
  ravicomp_interface.memory_allocator = (C_MemoryAllocator *)0x0;
  ravicomp_interface.generated_code = (char *)debug_message;
  ravicomp_interface.debug_message = error_message;
  if (ccontext.jit == (ravi_State *)0x0) {
    prVar1->id = prVar1->id + 1;
    snprintf((char *)&ravicomp_interface.compiler_options,0x1f,"__luachunk_%lld");
  }
  else {
    snprintf((char *)&ravicomp_interface.compiler_options,0x1f,"%s",ccontext.jit);
  }
  iVar2 = raviX_compile(&stack0xffffffffffffff30);
  if (iVar2 != 0) {
    raviX_release(&stack0xffffffffffffff30);
    destroy_mspace(ravicomp_interface.error_message);
    lua_error(L);
  }
  else {
    lua_pushstring(L,(char *)ravicomp_interface.memory_allocator);
    raviX_release(&stack0xffffffffffffff30);
    destroy_mspace(ravicomp_interface.error_message);
  }
  L_local._4_4_ = (uint)(iVar2 == 0);
  return L_local._4_4_;
}

Assistant:

static int parse(lua_State* L) {
  const char* s = luaL_checkstring(L, 1);
  const char* mainfunc = NULL;
  if (lua_isstring(L, 2)) {
    mainfunc = luaL_checkstring(L, 2);
  }
  struct CompilerContext ccontext = {.L = L, .jit = G(L)->ravi_state};
  C_MemoryAllocator allocator = {.arena = create_mspace(0, 0),
                                 .create_arena = create_mspace,
                                 .destroy_arena = destroy_mspace,
                                 .calloc = mspace_calloc,
                                 .realloc = mspace_realloc,
                                 .free = mspace_free};
  struct Ravi_CompilerInterface ravicomp_interface = {.source = s,
                                                      .source_len = strlen(s),
                                                      .source_name = "input",
                                                      .generated_code = NULL,
                                                      .context = &ccontext,
                                                      .compiler_options = "--dump-ast",
                                                      .memory_allocator = &allocator,
                                                      .debug_message = debug_message,
                                                      .error_message = error_message};
  if (mainfunc) {
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "%s", mainfunc);
  }
  else {
#ifdef USE_MIRJIT
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "__luachunk_%lld",
             ccontext.jit->id++);
#else
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "mymain");
#endif
  }
  int rc = raviX_compile(&ravicomp_interface);
  if (rc == 0) {
    lua_pushstring(L, ravicomp_interface.generated_code);
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    return 1;
  }
  else {
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    lua_error(L);
    return 0;
  }
}